

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O2

void ogt_mesh_remove_duplicate_vertices(ogt_voxel_meshify_context *ctx,ogt_mesh *mesh)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  uint32_t *puVar5;
  ogt_mesh_vertex *poVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint32_t i;
  uint uVar10;
  uint32_t uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  void *__s;
  void *__s_00;
  ulong uVar15;
  ulong uVar16;
  uint32_t data_len;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  void *__s1;
  
  puVar5 = mesh->indices;
  if (((puVar5 != (uint32_t *)0x0) && (uVar3 = mesh->index_count, uVar3 != 0)) &&
     (poVar6 = mesh->vertices, poVar6 != (ogt_mesh_vertex *)0x0)) {
    uVar4 = mesh->vertex_count;
    uVar15 = (ulong)uVar4;
    if (uVar4 != 0) {
      uVar14 = 1;
      do {
        uVar10 = uVar14;
        uVar14 = uVar10 * 2;
      } while (uVar10 < uVar4);
      __s = _voxel_meshify_malloc(ctx,(ulong)uVar10 << 2);
      memset(__s,0xff,(ulong)uVar10 << 2);
      __s_00 = _voxel_meshify_malloc(ctx,uVar15 * 4);
      memset(__s_00,0xff,uVar15 * 4);
      uVar17 = 0;
      uVar4 = 0;
      do {
        if (uVar17 == uVar15) {
          uVar16 = 0;
          for (uVar17 = 0; uVar15 * 0x20 != uVar17; uVar17 = uVar17 + 0x20) {
            uVar14 = *(uint *)((long)__s_00 + uVar16 * 4);
            if (uVar16 < uVar14) {
              __assert_fail("dst_index <= src_index",
                            "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                            ,0x1cb,
                            "void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context *, ogt_mesh *)"
                           );
            }
            uVar18 = (ulong)(uVar14 << 5);
            puVar2 = (undefined8 *)((long)&(poVar6->pos).x + (uVar17 & 0xffffffff));
            uVar7 = *puVar2;
            uVar8 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(poVar6->normal).y + (uVar17 & 0xffffffff));
            uVar9 = puVar2[1];
            puVar1 = (undefined8 *)((long)&(poVar6->normal).y + uVar18);
            *puVar1 = *puVar2;
            puVar1[1] = uVar9;
            puVar2 = (undefined8 *)((long)&(poVar6->pos).x + uVar18);
            *puVar2 = uVar7;
            puVar2[1] = uVar8;
            uVar16 = uVar16 + 1;
          }
          for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
            puVar5[uVar15] = *(uint32_t *)((long)__s_00 + (ulong)puVar5[uVar15] * 4);
          }
          _voxel_meshify_free(ctx,__s);
          _voxel_meshify_free(ctx,__s_00);
          if (uVar4 <= mesh->vertex_count) {
            mesh->vertex_count = uVar4;
            return;
          }
          __assert_fail("num_unique_vertices <= mesh->vertex_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                        ,0x1d6,
                        "void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context *, ogt_mesh *)"
                       );
        }
        data_len = (uint32_t)uVar17;
        __s1 = (void *)((long)&(poVar6->pos).x + (ulong)(data_len << 5));
        uVar11 = murmur_hash2_size4((uint32_t)__s1,(uint32_t *)0x20,data_len);
        iVar13 = 1;
        while( true ) {
          if (uVar10 - 1 < iVar13 - 1U) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                          ,0x186,
                          "uint32_t *hash_table_find_vertex(uint32_t *, uint32_t, const uint8_t *, uint32_t, uint32_t)"
                         );
          }
          uVar19 = uVar11 & uVar10 - 1;
          uVar14 = *(uint *)((long)__s + (ulong)uVar19 * 4);
          uVar16 = (ulong)uVar14;
          if (uVar16 == 0xffffffff) {
            *(uint32_t *)((long)__s + (ulong)uVar19 * 4) = data_len;
            uVar14 = uVar4;
            uVar4 = uVar4 + 1;
            goto LAB_001096eb;
          }
          iVar12 = bcmp(__s1,(void *)((long)&(poVar6->pos).x + (ulong)(uVar14 << 5)),0x20);
          if (iVar12 == 0) break;
          uVar11 = uVar19 + iVar13;
          iVar13 = iVar13 + 1;
        }
        if (uVar17 <= uVar16) {
          __assert_fail("*existing_index < vertex_index",
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                        ,0x17f,
                        "uint32_t *hash_table_find_vertex(uint32_t *, uint32_t, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        uVar14 = *(uint *)((long)__s_00 + uVar16 * 4);
        if (uVar14 == 0xffffffff) {
          __assert_fail("remap_indices[*hash_table_entry] != UINT32_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                        ,0x1c2,
                        "void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context *, ogt_mesh *)"
                       );
        }
LAB_001096eb:
        *(uint *)((long)__s_00 + uVar17 * 4) = uVar14;
        uVar17 = uVar17 + 1;
      } while( true );
    }
  }
  __assert_fail("indices && index_count && vertices && vertex_count && vertex_size",
                "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                ,0x1ab,
                "void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context *, ogt_mesh *)"
               );
}

Assistant:

void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context* ctx, ogt_mesh* mesh) {
    
    uint32_t* indices      = mesh->indices;
    uint32_t  index_count  = mesh->index_count;
    uint8_t*  vertices     = (uint8_t*)mesh->vertices;
    uint32_t  vertex_count = mesh->vertex_count;
    uint32_t  vertex_size  = sizeof(ogt_mesh_vertex);
    assert(indices && index_count && vertices && vertex_count && vertex_size);
    
    // allocate a hash table that is sized at the next power of 2 above the vertex count
    uint32_t hash_table_size = 1;
    while (hash_table_size < vertex_count)
        hash_table_size *= 2;
    uint32_t hash_table_mask = hash_table_size - 1;
    uint32_t* hash_table = (uint32_t*)_voxel_meshify_malloc(ctx, sizeof(uint32_t) * hash_table_size);
    memset(hash_table, -1, hash_table_size * sizeof(uint32_t));

    // generate an remap table for vertex indices
    uint32_t* remap_indices = (uint32_t*)_voxel_meshify_malloc(ctx, sizeof(uint32_t) * vertex_count);
    memset(remap_indices, -1, vertex_count * sizeof(uint32_t));
    uint32_t num_unique_vertices = 0;
    for (uint32_t vertex_index = 0; vertex_index < vertex_count; vertex_index++) {
        uint32_t* hash_table_entry = hash_table_find_vertex(hash_table, hash_table_mask, vertices, vertex_size, vertex_index);
        if (*hash_table_entry == UINT32_MAX) {
            // vertex is not already in the hash table. allocate a unique index for it.
            *hash_table_entry = vertex_index;;
            remap_indices[vertex_index] = num_unique_vertices++;
        }
        else {
            // vertex is already in the hash table. Point this to the index that is already existing!
            assert(remap_indices[*hash_table_entry] != UINT32_MAX);
            remap_indices[vertex_index] = remap_indices[*hash_table_entry];
        }
    }

    // compact all vertices using the remap_indices map.
    for (uint32_t i = 0; i < vertex_count; i++) {
        uint32_t dst_index = remap_indices[i];
        uint32_t src_index = i;
        assert(dst_index <= src_index);
        memcpy(&vertices[dst_index*vertex_size], &vertices[src_index*vertex_size], vertex_size);
    }
    // remap all indices now
    for (uint32_t i = 0; i < index_count; i++) {
        indices[i] = remap_indices[indices[i]];
    }

    _voxel_meshify_free(ctx, hash_table);
    _voxel_meshify_free(ctx, remap_indices);

    assert(num_unique_vertices <= mesh->vertex_count);
    mesh->vertex_count = num_unique_vertices;
}